

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O0

int32_t borg_power_dynamic(void)

{
  bool bVar1;
  borg_item_conflict *pbVar2;
  _Bool _Var3;
  int16_t iVar4;
  int16_t iVar5;
  int16_t iVar6;
  int16_t iVar7;
  int16_t iVar8;
  int16_t iVar9;
  int32_t iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  borg_magic *pbVar14;
  borg_item_conflict *local_58;
  borg_item_conflict *item_1;
  int k;
  borg_magic *as_1;
  int when;
  int what_1;
  borg_magic *as;
  int local_28;
  int what;
  int book;
  int max_sp;
  int max_wgt;
  int cur_wgt;
  borg_item_conflict *item;
  int32_t total;
  int i;
  
  item._0_4_ = 0;
  for (item._4_4_ = 0; item._4_4_ < borg_formulas.power.count; item._4_4_ = item._4_4_ + 1) {
    iVar10 = calc_power((borg_power_line *)borg_formulas.power.items[item._4_4_]);
    item._0_4_ = iVar10 + (int)item;
  }
  iVar11 = borg_spell_stat();
  if (0 < iVar11) {
    iVar4 = spell_chance(L'\0');
    item._0_4_ = (100 - iVar4) * 100 + (int)item;
  }
  _Var3 = flag_has_dbg((player->state).pflags,3,4,"player->state.pflags","(PF_ZERO_FAIL)");
  if ((_Var3) && (iVar4 = spell_chance(L'\0'), iVar4 < 1)) {
    item._0_4_ = (int)item + 30000;
  }
  pbVar2 = borg_items;
  if (borg_items[(int)(z_info->pack_size + 7)].iqty != '\0') {
    iVar11 = z_info->pack_size + 7;
    _Var3 = borg_ego_has_random_power(e_info + borg_items[iVar11].ego_idx);
    if ((_Var3) && ((pbVar2[iVar11].ident & 1U) == 0)) {
      item._0_4_ = (int)item + 999999;
    }
  }
  if (borg.trait[0xf] < 0xf) {
    iVar4 = borg_item_weight(borg_items + (int)(z_info->pack_size + 6));
    if (200 < iVar4) {
      iVar4 = borg_item_weight(borg_items + (int)(z_info->pack_size + 6));
      item._0_4_ = (int)item + (iVar4 + -200) * -0xf;
    }
    iVar4 = borg_item_weight(borg_items + (int)(z_info->pack_size + 9));
    if (0x1e < iVar4) {
      item._0_4_ = (int)item + -0xfa;
    }
    iVar4 = borg_item_weight(borg_items + (int)(z_info->pack_size + 8));
    if (10 < iVar4) {
      item._0_4_ = (int)item + -0xfa;
    }
    iVar4 = borg_item_weight(borg_items + (int)(z_info->pack_size + 0xb));
    if (0x32 < iVar4) {
      item._0_4_ = (int)item + -0xfa;
    }
  }
  iVar4 = borg_item_weight(borg_items + (int)(z_info->pack_size + 6));
  iVar5 = borg_item_weight(borg_items + (int)(z_info->pack_size + 9));
  iVar6 = borg_item_weight(borg_items + (int)(z_info->pack_size + 8));
  iVar7 = borg_item_weight(borg_items + (int)(z_info->pack_size + 7));
  iVar8 = borg_item_weight(borg_items + (int)(z_info->pack_size + 10));
  iVar9 = borg_item_weight(borg_items + (int)(z_info->pack_size + 0xb));
  iVar12 = (int)iVar9 + (int)iVar8 + (int)iVar7 + (int)iVar6 + (int)iVar5 + (int)iVar4;
  iVar11 = (player->class->magic).spell_weight;
  _Var3 = borg_can_cast();
  if ((_Var3) && (0 < (iVar12 - iVar11) / 10)) {
    iVar13 = (borg.trait[0x20] / 100 + 1) - (iVar12 - iVar11) / 10;
    if ((299 < iVar13) && (iVar13 < 0x15f)) {
      item._0_4_ = (int)item + ((iVar12 - iVar11) / 10) * -400;
    }
    if ((199 < iVar13) && (iVar13 < 300)) {
      item._0_4_ = (int)item + ((iVar12 - iVar11) / 10) * -800;
    }
    if ((99 < iVar13) && (iVar13 < 200)) {
      item._0_4_ = (int)item + ((iVar12 - iVar11) / 10) * -0x640;
    }
    if (iVar13 < 100) {
      item._0_4_ = (int)item + ((iVar12 - iVar11) / 10) * -0xc80;
    }
  }
  if ((((borg.trait[0x6a] < 0x29) && (0x18 < borg.trait[0x6a])) && (borg.trait[0x2d] < 100000)) &&
     ((borg_items[z_info->pack_size].tval != '\x06' && (borg.trait[0xff] == 1)))) {
    item._0_4_ = (int)item + 5000;
  }
  for (local_28 = 0; local_28 < 9; local_28 = local_28 + 1) {
    if (borg.amt_book[local_28] != 0) {
      if (((player->class->magic).books[local_28].dungeon & 1U) == 0) {
        as_1._0_4_ = 99;
        as_1._4_4_ = 0;
        while ((as_1._4_4_ < 9 &&
               (pbVar14 = borg_get_spell_entry(local_28,as_1._4_4_), pbVar14 != (borg_magic *)0x0)))
        {
          if (pbVar14->level < (uint)as_1) {
            as_1._0_4_ = (uint)pbVar14->level;
          }
          as_1._4_4_ = as_1._4_4_ + 1;
        }
        if (((uint)as_1 < 6) || ((int)(uint)as_1 < borg.trait[0x24] + 2)) {
          item_1._4_4_ = 0;
          while( true ) {
            bVar1 = false;
            if (item_1._4_4_ < 1) {
              bVar1 = item_1._4_4_ < borg.amt_book[local_28];
            }
            if (!bVar1) break;
            item._0_4_ = (int)item + 500000;
            item_1._4_4_ = item_1._4_4_ + 1;
          }
          if (5 < *borg.trait) {
            while( true ) {
              bVar1 = false;
              if (item_1._4_4_ < 2) {
                bVar1 = item_1._4_4_ < borg.amt_book[local_28];
              }
              if (!bVar1) break;
              item._0_4_ = (int)item + 10000;
              item_1._4_4_ = item_1._4_4_ + 1;
            }
          }
        }
      }
      else {
        as._4_4_ = 0;
        while ((as._4_4_ < 9 &&
               (pbVar14 = borg_get_spell_entry(local_28,as._4_4_), pbVar14 != (borg_magic *)0x0))) {
          if (((int)(uint)pbVar14->level <= borg.trait[0x24]) &&
             ((int)(uint)pbVar14->power <= borg.trait[0x1f])) {
            item._0_4_ = (int)item + 15000;
          }
          as._4_4_ = as._4_4_ + 1;
        }
      }
    }
  }
  if (borg.trait[0x105] / 2 < borg.trait[0x104]) {
    local_58 = (borg_item_conflict *)0x0;
    for (item._4_4_ = (uint)z_info->pack_size - borg.trait[0x9e]; -1 < item._4_4_;
        item._4_4_ = item._4_4_ + -1) {
      if (borg_items[item._4_4_].iqty != '\0') {
        local_58 = borg_items + item._4_4_;
        break;
      }
    }
    if ((((local_58 == (borg_item_conflict *)0x0) || (local_58->iqty == '\0')) ||
        ((local_58->aware & 1U) == 0)) ||
       (((local_58->tval != '\x19' ||
         ((((((uint)local_58->sval != sv_scroll_enchant_armor || (999 < borg.trait[0xed])) ||
            (borg.trait[0xf0] == 0)) &&
           ((((uint)local_58->sval != sv_scroll_enchant_weapon_to_hit || (999 < borg.trait[0xea]))
            || (borg.trait[0xf1] == 0)))) &&
          (((((uint)local_58->sval != sv_scroll_enchant_weapon_to_dam || (999 < borg.trait[0xeb]))
            || (borg.trait[0xf2] == 0)) &&
           (((uint)local_58->sval != sv_scroll_star_enchant_weapon &&
            ((uint)local_58->sval != sv_scroll_star_enchant_armor)))))))) &&
        ((local_58->tval != '\x1a' ||
         ((((uint)local_58->sval != sv_potion_inc_str && ((uint)local_58->sval != sv_potion_inc_int)
           ) && (((uint)local_58->sval != sv_potion_inc_wis &&
                 ((((uint)local_58->sval != sv_potion_inc_dex &&
                   ((uint)local_58->sval != sv_potion_inc_con)) &&
                  ((uint)local_58->sval != sv_potion_inc_all)))))))))))) {
      item._0_4_ = (int)item +
                   ((borg.trait[0x104] - borg.trait[0x105] / 2) / (borg.trait[0x105] / 10)) * -1000;
    }
  }
  return (int)item;
}

Assistant:

int32_t borg_power_dynamic(void)
{
    int     i;
    int32_t total = 0;

    /* MAX is used for "any" */
    for (i = 0; i < borg_formulas.power.count; i++) {
        total += calc_power(borg_formulas.power.items[i]);
    }

    /* HUGE HACK need some extra stuff that is hard to make dynamic*/
    if (borg_spell_stat() > 0)
        total += (100 - spell_chance(0)) * 100;

    /* should try to get min fail to 0 */
    if (player_has(player, PF_ZERO_FAIL)) {
        /* other fail rates */
        if (spell_chance(0) < 1)
            total += 30000L;
    }

    /*
     * Hack-- Reward the borg for carrying a NON-ID items that have random
     * powers
     */
    if (borg_items[INVEN_OUTER].iqty) {
        borg_item *item = &borg_items[INVEN_OUTER];
        if (((borg_ego_has_random_power(&e_info[item->ego_idx])
                && !item->ident)))
            total += 999999L;
    }

    /*** Penalize armor weight ***/
    if (borg.trait[BI_STR_INDEX] < 15) {
        if (borg_item_weight(&borg_items[INVEN_BODY]) > 200)
            total -= (borg_item_weight(&borg_items[INVEN_BODY]) - 200) * 15;
        if (borg_item_weight(&borg_items[INVEN_HEAD]) > 30)
            total -= 250;
        if (borg_item_weight(&borg_items[INVEN_ARM]) > 10)
            total -= 250;
        if (borg_item_weight(&borg_items[INVEN_FEET]) > 50)
            total -= 250;
    }

    /* Compute the total armor weight */
    int cur_wgt = 0;
    cur_wgt += borg_item_weight(&borg_items[INVEN_BODY]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_HEAD]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_ARM]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_OUTER]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_HANDS]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_FEET]);

    /* Determine the weight allowance */
    int max_wgt = player->class->magic.spell_weight;

    /* Hack -- heavy armor hurts magic */
    if (borg_can_cast() && ((cur_wgt - max_wgt) / 10) > 0) {
        /* max sp must be calculated in case it changed with the armor */
        int max_sp = borg.trait[BI_SP_ADJ] / 100 + 1;
        max_sp -= ((cur_wgt - max_wgt) / 10);
        /* Mega-Hack -- Penalize heavy armor which hurts mana */
        if (max_sp >= 300 && max_sp <= 350)
            total -= (((cur_wgt - max_wgt) / 10) * 400L);
        if (max_sp >= 200 && max_sp <= 299)
            total -= (((cur_wgt - max_wgt) / 10) * 800L);
        if (max_sp >= 100 && max_sp <= 199)
            total -= (((cur_wgt - max_wgt) / 10) * 1600L);
        if (max_sp <= 99)
            total -= (((cur_wgt - max_wgt) / 10) * 3200L);
    }
    /* END MAJOR HACK */

    /* SECOND MAJOR HACK for inventory */

    /* Reward carrying a shovel if low level */
    if (borg.trait[BI_MAXDEPTH] <= 40 && borg.trait[BI_MAXDEPTH] >= 25
        && borg.trait[BI_GOLD] < 100000
        && borg_items[INVEN_WIELD].tval != TV_DIGGING
        && borg.trait[BI_ADIGGER] == 1)
        total += 5000L;

    /*** Hack -- books ***/
    /*   Reward books    */
    for (int book = 0; book < 9; book++) {
        /* No copies */
        if (!borg.amt_book[book])
            continue;

        /* The "hard" books */
        if (player->class->magic.books[book].dungeon) {
            int what;

            /* Scan the spells */
            for (what = 0; what < 9; what++) {
                borg_magic *as = borg_get_spell_entry(book, what);
                if (!as)
                    break;

                /* Track minimum level */
                if (as->level > borg.trait[BI_MAXCLEVEL])
                    continue;

                /* Track Mana req. */
                if (as->power > borg.trait[BI_MAXSP])
                    continue;

                /* Reward the book based on the spells I can cast */
                total += 15000L;
            }
        }

        /* The "easy" books */
        else {
            int what, when = 99;

            /* Scan the spells */
            for (what = 0; what < 9; what++) {
                borg_magic *as = borg_get_spell_entry(book, what);
                if (!as)
                    break;

                /* Track minimum level */
                if (as->level < when)
                    when = as->level;

                /* Track Mana req. */
                /* if (as->power < mana) mana = as->power; */
            }

            /* Hack -- Ignore "difficult" normal books */
            if ((when > 5) && (when >= borg.trait[BI_MAXCLEVEL] + 2))
                continue;
            /* if (mana > borg.trait[BI_MAXSP]) continue; */

            /* Reward the book */
            int k = 0;
            for (; k < 1 && k < borg.amt_book[book]; k++)
                total += 500000L;
            if (borg.trait[BI_STR] > 5)
                for (; k < 2 && k < borg.amt_book[book]; k++)
                    total += 10000L;
        }
    }

    /*  Hack -- Apply "encumbrance" from weight */

    /* XXX XXX XXX Apply "encumbrance" from weight */
    if (borg.trait[BI_WEIGHT] > borg.trait[BI_CARRY] / 2) {
        /* *HACK*  when testing items, the borg puts them in the last empty
         */
        /* slot so this is POSSIBLY just a test item */
        borg_item *item = NULL;
        for (i = PACK_SLOTS; i >= 0; i--) {
            if (borg_items[i].iqty) {
                item = &borg_items[i];
                break;
            }
        }

        /* Some items will be used immediately and should not contribute to
         * encumbrance */
        if (item && item->iqty && item->aware
            && ((item->tval == TV_SCROLL
                    && ((item->sval == sv_scroll_enchant_armor
                            && borg.trait[BI_AENCH_ARM] < 1000
                            && borg.trait[BI_NEED_ENCHANT_TO_A])
                        || (item->sval == sv_scroll_enchant_weapon_to_hit
                            && borg.trait[BI_AENCH_TOH] < 1000
                            && borg.trait[BI_NEED_ENCHANT_TO_H])
                        || (item->sval == sv_scroll_enchant_weapon_to_dam
                            && borg.trait[BI_AENCH_TOD] < 1000
                            && borg.trait[BI_NEED_ENCHANT_TO_D])
                        || item->sval == sv_scroll_star_enchant_weapon
                        || item->sval == sv_scroll_star_enchant_armor))
                || (item->tval == TV_POTION
                    && (item->sval == sv_potion_inc_str
                        || item->sval == sv_potion_inc_int
                        || item->sval == sv_potion_inc_wis
                        || item->sval == sv_potion_inc_dex
                        || item->sval == sv_potion_inc_con
                        || item->sval == sv_potion_inc_all)))) {
            /* No encumbrance penalty for purchasing these items */
        } else {
            total -= ((borg.trait[BI_WEIGHT] - (borg.trait[BI_CARRY] / 2))
                      / (borg.trait[BI_CARRY] / 10) * 1000L);
        }
    }
    /* END SECOND MAJOR HACK */

    return total;
}